

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)75,(moira::Mode)10,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  StrWriter *pSVar4;
  long lVar5;
  char cVar6;
  Ea<(moira::Mode)10,_(moira::Size)1> src;
  Ea<(moira::Mode)10,_(moira::Size)1> local_24;
  
  Op<(moira::Mode)10,(moira::Size)1>(&local_24,this,op & 7,addr);
  pcVar3 = "move";
  if (str->upper != false) {
    pcVar3 = "MOVE";
  }
  cVar6 = *pcVar3;
  while (cVar6 != '\0') {
    pcVar3 = pcVar3 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar6;
    cVar6 = *pcVar3;
  }
  iVar1 = (this->tab).raw;
  while (pcVar3 = str->ptr, pcVar3 < str->base + iVar1) {
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  pSVar4 = StrWriter::operator<<(str,&local_24);
  cVar6 = ',';
  lVar5 = 1;
  do {
    pcVar3 = pSVar4->ptr;
    pSVar4->ptr = pcVar3 + 1;
    *pcVar3 = cVar6;
    cVar6 = ", CCR"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,Byte> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src << ", CCR";
}